

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O1

int nni_url_to_address(nng_sockaddr *sa,nng_url *url)

{
  nng_err nVar1;
  char *pcVar2;
  char *pcVar3;
  int iVar4;
  undefined1 local_210 [8];
  nni_aio aio;
  nni_resolv_item ri;
  
  pcVar3 = url->u_scheme;
  pcVar2 = strchr(pcVar3,0x34);
  iVar4 = 3;
  if (pcVar2 == (char *)0x0) {
    pcVar3 = strchr(pcVar3,0x36);
    iVar4 = (uint)(pcVar3 != (char *)0x0) << 2;
  }
  nni_aio_init((nni_aio *)local_210,(nni_cb)0x0,(void *)0x0);
  aio.a_reap_node.rn_next._4_1_ = 1;
  aio.a_reap_node.rn_next._0_4_ = iVar4;
  aio.a_reap_node.rn_next._5_3_ = 0;
  nni_resolv((nni_resolv_item *)&aio.a_reap_node,(nni_aio *)local_210);
  nni_aio_wait((nni_aio *)local_210);
  nVar1 = nni_aio_result((nni_aio *)local_210);
  nni_aio_fini((nni_aio *)local_210);
  return nVar1;
}

Assistant:

int
nni_url_to_address(nng_sockaddr *sa, const nng_url *url)
{
	int             af;
	nni_aio         aio;
	const char     *h;
	int             rv;
	nni_resolv_item ri;

	// This assumes the scheme is one that uses TCP/IP addresses.

	if (strchr(url->u_scheme, '4') != NULL) {
		af = NNG_AF_INET;
	} else if (strchr(url->u_scheme, '6') != NULL) {
		af = NNG_AF_INET6;
	} else {
		af = NNG_AF_UNSPEC;
	}

	nni_aio_init(&aio, NULL, NULL);

	h = url->u_hostname;
	if ((h != NULL) && (strcmp(h, "") == 0)) {
		h = NULL;
	}

	memset(&ri, 0, sizeof(ri));
	ri.ri_family  = af;
	ri.ri_passive = true;
	ri.ri_host    = h;
	ri.ri_port    = url->u_port;
	ri.ri_sa      = sa;
	nni_resolv(&ri, &aio);
	nni_aio_wait(&aio);
	rv = nni_aio_result(&aio);
	nni_aio_fini(&aio);
	return (rv);
}